

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ev_dfg.c
# Opt level: O0

void add_bridge_stones(EVdfg dfg,EVdfg_configuration config)

{
  uint *puVar1;
  FILE *__stream;
  int iVar2;
  __pid_t _Var3;
  undefined8 *puVar4;
  pthread_t pVar5;
  int *in_RSI;
  EVdfg_stone_state in_RDI;
  EVdfg unaff_retaddr;
  timespec ts;
  EVdfg_config_action act;
  EVdfg_stone_state bridge;
  int k;
  EVdfg_stone_state target;
  EVdfg_stone_state cur;
  int j;
  int i;
  timespec local_68;
  undefined8 local_58;
  undefined8 local_50;
  undefined8 local_48;
  undefined8 local_40;
  uint *puVar6;
  undefined4 in_stack_ffffffffffffffd0;
  int iVar7;
  uint *local_28;
  int local_18;
  int local_14;
  
  local_14 = 0;
  do {
    if (*in_RSI <= local_14) {
      return;
    }
    for (local_18 = 0;
        local_18 < *(int *)(*(long *)(*(long *)(in_RSI + 2) + (long)local_14 * 8) + 0x20);
        local_18 = local_18 + 1) {
      puVar1 = *(uint **)(*(long *)(in_RSI + 2) + (long)local_14 * 8);
      local_28 = (uint *)0x0;
      for (iVar7 = 0; iVar7 < *in_RSI; iVar7 = iVar7 + 1) {
        if (*(int *)(*(long *)(*(long *)(in_RSI + 2) + (long)iVar7 * 8) + 8) ==
            *(int *)(*(long *)(puVar1 + 10) + (long)local_18 * 4)) {
          local_28 = *(uint **)(*(long *)(in_RSI + 2) + (long)iVar7 * 8);
        }
      }
      if (((local_28 != (uint *)0x0) && (puVar1[1] == 0)) && (*puVar1 != *local_28)) {
        puVar6 = (uint *)0x0;
        iVar7 = create_bridge_stone(unaff_retaddr,in_RDI,(int)((ulong)in_RSI >> 0x20));
        *(int *)(*(long *)(puVar1 + 10) + (long)local_18 * 4) = iVar7;
        for (iVar7 = 0; iVar7 < *in_RSI; iVar7 = iVar7 + 1) {
          if (*(int *)(*(long *)(*(long *)(in_RSI + 2) + (long)iVar7 * 8) + 8) ==
              *(int *)(*(long *)(puVar1 + 10) + (long)local_18 * 4)) {
            puVar6 = *(uint **)(*(long *)(in_RSI + 2) + (long)iVar7 * 8);
          }
        }
        for (iVar7 = 0; iVar7 < in_RSI[4]; iVar7 = iVar7 + 1) {
          puVar4 = (undefined8 *)(*(long *)(in_RSI + 6) + (long)iVar7 * 0x20);
          local_58 = *puVar4;
          local_50 = puVar4[1];
          local_48 = puVar4[2];
          local_40 = puVar4[3];
          if ((((int)local_58 == 4) || ((int)local_58 == 5)) &&
             (local_48._4_4_ = (uint)((ulong)local_48 >> 0x20), local_48._4_4_ == local_28[2])) {
            *(uint *)(*(long *)(in_RSI + 6) + (long)iVar7 * 0x20 + 0x14) = puVar6[2];
            break;
          }
        }
        *puVar6 = *puVar1;
        iVar2 = CMtrace_val[0xd];
        if (*(long *)(**(long **)&in_RDI->stone_id + 0x120) == 0) {
          iVar2 = CMtrace_init((CManager)CONCAT44(iVar7,in_stack_ffffffffffffffd0),
                               (CMTraceType)((ulong)puVar6 >> 0x20));
        }
        if (iVar2 != 0) {
          if (CMtrace_PID != 0) {
            __stream = *(FILE **)(**(long **)&in_RDI->stone_id + 0x120);
            _Var3 = getpid();
            pVar5 = pthread_self();
            fprintf(__stream,"P%lxT%lx - ",(long)_Var3,pVar5);
          }
          if (CMtrace_timing != 0) {
            clock_gettime(1,&local_68);
            fprintf(*(FILE **)(**(long **)&in_RDI->stone_id + 0x120),"%lld.%.9ld - ",local_68.tv_sec
                    ,local_68.tv_nsec);
          }
          fprintf(*(FILE **)(**(long **)&in_RDI->stone_id + 0x120),
                  "Created bridge stone %x, target node is %d, assigned to node %d\n",
                  (ulong)*(uint *)(*(long *)(puVar1 + 10) + (long)local_18 * 4),(ulong)*local_28,
                  (ulong)*puVar1);
        }
        fflush(*(FILE **)(**(long **)&in_RDI->stone_id + 0x120));
      }
    }
    local_14 = local_14 + 1;
  } while( true );
}

Assistant:

static void
add_bridge_stones(EVdfg dfg, EVdfg_configuration config)
{
    int i;
    for (i=0; i< config->stone_count; i++) {
	int j;
	for (j = 0; j < config->stones[i]->out_count; j++) {
	    EVdfg_stone_state cur = config->stones[i];
	    EVdfg_stone_state target = NULL;
	    int k;
	    for (k = 0; k < config->stone_count; k++) {
		if (config->stones[k]->stone_id == cur->out_links[j]) {
		    target = config->stones[k];
		}
	    }
	    if (target && (!cur->bridge_stone) && (cur->node != target->node)) {
		EVdfg_stone_state bridge = NULL;
		cur->out_links[j] = create_bridge_stone(dfg, target, cur->node);
		/* put the bridge stone where the source stone is */
		for (k = 0; k < config->stone_count; k++) {
		    if (config->stones[k]->stone_id == cur->out_links[j]) {
			bridge = config->stones[k];
		    }
		}
		for (k = 0; k < config->pending_action_count; k++) {
		    EVdfg_config_action act = config->pending_action_queue[k];
		    if (((act.type == ACT_link_port) || (act.type == ACT_link_dest)) &&
			(act.u.link.dest_id == target->stone_id)) {
			config->pending_action_queue[k].u.link.dest_id = bridge->stone_id;
			break;
		    }
		}
		bridge->node = cur->node;
		CMtrace_out(dfg->master->cm, EVdfgVerbose, "Created bridge stone %x, target node is %d, assigned to node %d\n", cur->out_links[j], target->node, cur->node);
	    }
	}
    }
}